

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O2

void constructor_destroy(constructor ctor)

{
  set *ppsVar1;
  ulong uVar2;
  
  if (ctor != (constructor)0x0) {
    ppsVar1 = &ctor[1].map;
    for (uVar2 = 0; uVar2 < ctor->count; uVar2 = uVar2 + 1) {
      free(*ppsVar1);
      ppsVar1 = ppsVar1 + 3;
    }
    set_destroy(ctor->map);
    free(ctor);
    return;
  }
  return;
}

Assistant:

void constructor_destroy(constructor ctor)
{
	if (ctor != NULL)
	{
		size_t index;

		for (index = 0; index < ctor->count; ++index)
		{
			constructor_node node = constructor_at(ctor, index);

			if (node != NULL && node->name != NULL)
			{
				free(node->name);
			}
		}

		set_destroy(ctor->map);

		free(ctor);
	}
}